

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

RPCHelpMan * wallet::listlockunspent(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff848;
  undefined8 in_stack_fffffffffffff850;
  undefined8 in_stack_fffffffffffff858;
  undefined8 in_stack_fffffffffffff860;
  _Manager_type in_stack_fffffffffffff868;
  undefined8 in_stack_fffffffffffff870;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff878;
  pointer in_stack_fffffffffffff888;
  pointer pRVar2;
  pointer in_stack_fffffffffffff890;
  pointer pRVar3;
  pointer in_stack_fffffffffffff898;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff8a0;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff8c0;
  pointer in_stack_fffffffffffff8d0;
  RPCMethodImpl in_stack_fffffffffffff8d8;
  allocator<char> local_6f2;
  allocator<char> local_6f1;
  RPCResults local_6f0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_6d8;
  allocator<char> local_6b2;
  allocator<char> local_6b1;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  char *local_3b0;
  size_type local_3a8;
  char local_3a0 [8];
  undefined8 uStack_398;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  RPCResult local_310 [2];
  string local_200 [32];
  string local_1e0 [32];
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"listlockunspent",&local_6b1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "\nReturns list of temporarily unspendable outputs.\nSee the lockunspent call to lock and unlock transactions for spending.\n"
             ,&local_6b2);
  local_6d8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_6d8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_6d8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_6f1);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_6f2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,"",(allocator<char> *)&stack0xfffffffffffff8ef);
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,"",(allocator<char> *)&stack0xfffffffffffff8ee);
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,"txid",(allocator<char> *)&stack0xfffffffffffff8cf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,"The transaction id locked",(allocator<char> *)&stack0xfffffffffffff8ce);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff850;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff848;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff860;
  description._M_string_length = in_stack_fffffffffffff870;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff868;
  description.field_2 = in_stack_fffffffffffff878;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff890;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff888;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff898;
  RPCResult::RPCResult(local_310,STR_HEX,m_key_name,description,inner,SUB81(local_330,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"vout",(allocator<char> *)&stack0xfffffffffffff8a7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_390,"The vout value",(allocator<char> *)&stack0xfffffffffffff8a6);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff850;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff848;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff860;
  description_00._M_string_length = in_stack_fffffffffffff870;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff868;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff878._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_310 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_370,0));
  __l._M_len = 2;
  __l._M_array = local_310;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8d0,__l,
             (allocator_type *)&stack0xfffffffffffff887);
  m_key_name_01._M_string_length = in_stack_fffffffffffff850;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff848;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff860;
  description_01._M_string_length = in_stack_fffffffffffff870;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff868;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff878._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_1c0,OBJ,m_key_name_01,description_01,inner_01,SUB81(local_1e0,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_1c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f0,__l_00,
             (allocator_type *)&stack0xfffffffffffff886);
  m_key_name_02._M_string_length = in_stack_fffffffffffff850;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff848;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff858;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff860;
  description_02._M_string_length = in_stack_fffffffffffff870;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff868;
  description_02.field_2 = in_stack_fffffffffffff878;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_f8,ARR,m_key_name_02,description_02,inner_02,SUB81(local_118,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff850;
  result._0_8_ = in_stack_fffffffffffff848;
  result.m_key_name._M_string_length = in_stack_fffffffffffff858;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff860;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff868;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff870;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff878;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff8a0;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2 = in_stack_fffffffffffff8c0;
  RPCResults::RPCResults(&local_6f0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"listunspent",(allocator<char> *)&stack0xfffffffffffff885);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"",(allocator<char> *)&stack0xfffffffffffff884);
  HelpExampleCli(&local_4f0,&local_510,&local_530);
  std::operator+(&local_4d0,"\nList the unspent transactions\n",&local_4f0);
  std::operator+(&local_4b0,&local_4d0,"\nLock an unspent transaction\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"lockunspent",(allocator<char> *)&stack0xfffffffffffff883);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,
             "false \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\""
             ,(allocator<char> *)&stack0xfffffffffffff882);
  HelpExampleCli(&local_550,&local_570,&local_590);
  std::operator+(&local_490,&local_4b0,&local_550);
  std::operator+(&local_470,&local_490,"\nList the locked transactions\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"listlockunspent",(allocator<char> *)&stack0xfffffffffffff881);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"",(allocator<char> *)&stack0xfffffffffffff880);
  HelpExampleCli(&local_5b0,&local_5d0,&local_5f0);
  std::operator+(&local_450,&local_470,&local_5b0);
  std::operator+(&local_430,&local_450,"\nUnlock the transaction again\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"lockunspent",(allocator<char> *)&stack0xfffffffffffff87f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,
             "true \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\""
             ,(allocator<char> *)&stack0xfffffffffffff87e);
  HelpExampleCli(&local_610,&local_630,&local_650);
  std::operator+(&local_410,&local_430,&local_610);
  std::operator+(&local_3f0,&local_410,"\nAs a JSON-RPC call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"listlockunspent",(allocator<char> *)&stack0xfffffffffffff87d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"",(allocator<char> *)&stack0xfffffffffffff87c);
  HelpExampleRpc(&local_670,&local_690,&local_6b0);
  std::operator+(&local_3d0,&local_3f0,&local_670);
  local_3b0 = local_3a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p == &local_3d0.field_2) {
    uStack_398 = local_3d0.field_2._8_8_;
  }
  else {
    local_3b0 = local_3d0._M_dataplus._M_p;
  }
  local_3a8 = local_3d0._M_string_length;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/coins.cpp:402:9)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/coins.cpp:402:9)>
                ::_M_manager;
  description_03.field_2 = in_stack_fffffffffffff878;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8a0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._8_16_ = in_stack_fffffffffffff8c0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff8d0;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff850,&stack0xfffffffffffff858)),
             description_03,args,results,examples,in_stack_fffffffffffff8d8);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff858);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_6f0.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f0);
  RPCResult::~RPCResult(&local_1c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8d0);
  lVar1 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_310[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff888);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::string::~string(local_370);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8a8);
  std::__cxx11::string::~string(local_350);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_6d8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listlockunspent()
{
    return RPCHelpMan{"listlockunspent",
                "\nReturns list of temporarily unspendable outputs.\n"
                "See the lockunspent call to lock and unlock transactions for spending.\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "txid", "The transaction id locked"},
                            {RPCResult::Type::NUM, "vout", "The vout value"},
                        }},
                    }
                },
                RPCExamples{
            "\nList the unspent transactions\n"
            + HelpExampleCli("listunspent", "") +
            "\nLock an unspent transaction\n"
            + HelpExampleCli("lockunspent", "false \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\"") +
            "\nList the locked transactions\n"
            + HelpExampleCli("listlockunspent", "") +
            "\nUnlock the transaction again\n"
            + HelpExampleCli("lockunspent", "true \"[{\\\"txid\\\":\\\"a08e6907dbbd3d809776dbfc5d82e371b764ed838b5655e72f463568df1aadf0\\\",\\\"vout\\\":1}]\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("listlockunspent", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    std::vector<COutPoint> vOutpts;
    pwallet->ListLockedCoins(vOutpts);

    UniValue ret(UniValue::VARR);

    for (const COutPoint& outpt : vOutpts) {
        UniValue o(UniValue::VOBJ);

        o.pushKV("txid", outpt.hash.GetHex());
        o.pushKV("vout", (int)outpt.n);
        ret.push_back(std::move(o));
    }

    return ret;
},
    };
}